

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_receive(void *x,t_iemgui *iemgui,t_symbol *s)

{
  int iVar1;
  uint local_24;
  t_symbol *ptStack_20;
  int oldsndrcvable;
  t_symbol *s_local;
  t_iemgui *iemgui_local;
  void *x_local;
  
  local_24 = 0;
  if (((uint)iemgui->x_fsf >> 6 & 1) != 0) {
    local_24 = 2;
  }
  if (((uint)iemgui->x_fsf >> 7 & 1) != 0) {
    local_24 = local_24 | 1;
  }
  if (s == (t_symbol *)0x0) {
    iemgui->x_rcv_unexpanded = &s_;
    ptStack_20 = (t_symbol *)0x0;
  }
  else {
    iemgui->x_rcv_unexpanded = s;
    ptStack_20 = canvas_realizedollar(iemgui->x_glist,s);
  }
  if (ptStack_20 == (t_symbol *)0x0) {
    if (((uint)iemgui->x_fsf >> 6 & 1) != 0) {
      pd_unbind((t_pd *)iemgui,iemgui->x_rcv);
      iemgui->x_rcv = (t_symbol *)0x0;
    }
  }
  else {
    iVar1 = strcmp(ptStack_20->s_name,iemgui->x_rcv->s_name);
    if (iVar1 != 0) {
      if (((uint)iemgui->x_fsf >> 6 & 1) != 0) {
        pd_unbind((t_pd *)iemgui,iemgui->x_rcv);
      }
      iemgui->x_rcv = ptStack_20;
      pd_bind((t_pd *)iemgui,iemgui->x_rcv);
    }
  }
  iemgui->x_fsf =
       (t_iem_fstyle_flags)
       ((uint)iemgui->x_fsf & 0xffffffbf | (uint)(ptStack_20 != (t_symbol *)0x0) << 6);
  iemgui_verify_snd_ne_rcv(iemgui);
  iVar1 = glist_isvisible(iemgui->x_glist);
  if ((iVar1 != 0) && (iVar1 = gobj_shouldvis((t_gobj *)x,iemgui->x_glist), iVar1 != 0)) {
    (*iemgui->x_draw)(x,iemgui->x_glist,local_24 + 6);
  }
  return;
}

Assistant:

void iemgui_receive(void *x, t_iemgui *iemgui, t_symbol *s)
{
    int oldsndrcvable=0;

    if(iemgui->x_fsf.x_rcv_able)
        oldsndrcvable |= IEM_GUI_OLD_RCV_FLAG;
    if(iemgui->x_fsf.x_snd_able)
        oldsndrcvable |= IEM_GUI_OLD_SND_FLAG;

    if(s) {
        iemgui->x_rcv_unexpanded = s;
        s = canvas_realizedollar(iemgui->x_glist, s);
    } else {
        iemgui->x_rcv_unexpanded = &s_;
    }
    if(s)
    {
        if(strcmp(s->s_name, iemgui->x_rcv->s_name))
        {
            if(iemgui->x_fsf.x_rcv_able)
                pd_unbind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);
            iemgui->x_rcv = s;
            pd_bind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);
        }
    }
    else if(iemgui->x_fsf.x_rcv_able)
    {
        pd_unbind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);
        iemgui->x_rcv = s;
    }
    iemgui->x_fsf.x_rcv_able = (s!=0);
    iemgui_verify_snd_ne_rcv(iemgui);
    if(glist_isvisible(iemgui->x_glist) && gobj_shouldvis((t_gobj *)x, iemgui->x_glist))
        (*iemgui->x_draw)(x, iemgui->x_glist, IEM_GUI_DRAW_MODE_IO + oldsndrcvable);
}